

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_mesh.cpp
# Opt level: O3

bool __thiscall ON_MeshTopology::TopEdgeIsHidden(ON_MeshTopology *this,int topei)

{
  int iVar1;
  int iVar2;
  ON_Mesh *pOVar3;
  bool *pbVar4;
  ON_MeshTopologyVertex *pOVar5;
  ON_MeshTopologyEdge *pOVar6;
  long lVar7;
  bool bVar8;
  
  pOVar3 = this->m_mesh;
  if (((pOVar3 == (ON_Mesh *)0x0) || (pOVar3->m_hidden_count < 1)) ||
     ((pOVar3->m_H).m_count != (pOVar3->m_V).super_ON_SimpleArray<ON_3fPoint>.m_count)) {
    return false;
  }
  if (topei < 0) {
    return false;
  }
  pbVar4 = (pOVar3->m_H).m_a;
  if (pbVar4 == (bool *)0x0) {
    return false;
  }
  if ((this->m_tope).m_count <= topei) {
    return false;
  }
  pOVar5 = (this->m_topv).m_a;
  pOVar6 = (this->m_tope).m_a;
  iVar1 = pOVar6[(uint)topei].m_topvi[0];
  if ((long)pOVar5[iVar1].m_v_count < 1) {
    return true;
  }
  iVar2 = pOVar6[(uint)topei].m_topvi[1];
  lVar7 = 0;
  do {
    if (pbVar4[pOVar5[iVar1].m_vi[lVar7]] == false) {
      if ((long)pOVar5[iVar2].m_v_count < 1) {
        return true;
      }
      lVar7 = 0;
      do {
        if (pbVar4[pOVar5[iVar2].m_vi[lVar7]] != true) {
          return pbVar4[pOVar5[iVar2].m_vi[lVar7]];
        }
        bVar8 = (long)pOVar5[iVar2].m_v_count + -1 != lVar7;
        lVar7 = lVar7 + 1;
      } while (bVar8);
      return true;
    }
    lVar7 = lVar7 + 1;
  } while (pOVar5[iVar1].m_v_count != lVar7);
  return true;
}

Assistant:

bool ON_MeshTopology::TopEdgeIsHidden( int topei ) const
{
  // ugly - but faster than calling TopVertexIsHidden()
  const bool* bHiddenVertex = m_mesh ? m_mesh->HiddenVertexArray() : 0;
  if ( bHiddenVertex && topei >= 0 && topei < m_tope.Count()  )
  {
    const ON_MeshTopologyEdge& tope = m_tope[topei];
    const ON_MeshTopologyVertex& topv0 = m_topv[tope.m_topvi[0]];
    const ON_MeshTopologyVertex& topv1 = m_topv[tope.m_topvi[1]];
    int i;

    for ( i = 0; i < topv0.m_v_count; i++ )
    {
      if ( !bHiddenVertex[topv0.m_vi[i]] )
        break;
    }
    if ( i >= topv0.m_v_count )
      return true;

    for ( i = 0; i < topv1.m_v_count; i++ )
    {
      if ( !bHiddenVertex[topv1.m_vi[i]] )
        return false;
    }

    return true;
  }
  return false;
}